

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

ktx_error_code_e
ktxDetermineFileType_(ktxStream *pStream,ktxFileType_ *pFileType,ktxHeaderUnion_ *pHeader)

{
  int iVar1;
  void *in_RDX;
  int *in_RSI;
  undefined8 *in_RDI;
  ktx_error_code_e result;
  ktx_uint8_t ktx2_ident_ref [12];
  ktx_uint8_t ktx_ident_ref [12];
  ktx_error_code_e local_3c;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_2c;
  undefined4 local_24;
  void *local_20;
  int *local_18;
  undefined8 *local_10;
  
  local_2c = 0xbb31312058544bab;
  local_24 = 0xa1a0a0d;
  local_38 = 0xbb30322058544bab;
  local_30 = 0xa1a0a0d;
  if ((in_RDI == (undefined8 *)0x0) || (in_RSI == (int *)0x0)) {
    __assert_fail("pStream != NULL && pFileType != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x112,
                  "ktx_error_code_e ktxDetermineFileType_(ktxStream *, ktxFileType_ *, ktxHeaderUnion_ *)"
                 );
  }
  if (in_RDI[8] == 0) {
    __assert_fail("pStream->data.mem != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x113,
                  "ktx_error_code_e ktxDetermineFileType_(ktxStream *, ktxFileType_ *, ktxHeaderUnion_ *)"
                 );
  }
  if (((*(int *)(in_RDI + 7) != 1) && (*(int *)(in_RDI + 7) != 2)) && (*(int *)(in_RDI + 7) != 3)) {
    __assert_fail("pStream->type == eStreamTypeFile || pStream->type == eStreamTypeMemory || pStream->type == eStreamTypeCustom"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x116,
                  "ktx_error_code_e ktxDetermineFileType_(ktxStream *, ktxFileType_ *, ktxHeaderUnion_ *)"
                 );
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_3c = (*(code *)*in_RDI)(in_RDI,in_RDX,0xc);
  if (local_3c == KTX_SUCCESS) {
    iVar1 = memcmp(local_20,&local_2c,0xc);
    if (iVar1 == 0) {
      *local_18 = 0;
    }
    else {
      iVar1 = memcmp(local_20,&local_38,0xc);
      if (iVar1 != 0) {
        return KTX_UNKNOWN_FILE_FORMAT;
      }
      *local_18 = 1;
    }
    if (*local_18 == 0) {
      local_3c = (*(code *)*local_10)(local_10,(long)local_20 + 0xc,0x34);
    }
    else {
      local_3c = (*(code *)*local_10)(local_10,(long)local_20 + 0xc,0x44);
    }
  }
  return local_3c;
}

Assistant:

static KTX_error_code
ktxDetermineFileType_(ktxStream* pStream, ktxFileType_* pFileType,
                      ktxHeaderUnion_* pHeader)
{
    ktx_uint8_t ktx_ident_ref[12] = KTX_IDENTIFIER_REF;
    ktx_uint8_t ktx2_ident_ref[12] = KTX2_IDENTIFIER_REF;
    KTX_error_code result;

    assert(pStream != NULL && pFileType != NULL);
    assert(pStream->data.mem != NULL);
    assert(pStream->type == eStreamTypeFile
           || pStream->type == eStreamTypeMemory
           || pStream->type == eStreamTypeCustom);

    result = pStream->read(pStream, pHeader, sizeof(ktx2_ident_ref));
    if (result == KTX_SUCCESS) {
#if BIG_ENDIAN
        // byte swap the heaader fields
#endif
        // Compare identifier, is this a KTX  or KTX2 file?
        if (!memcmp(pHeader->ktx.identifier, ktx_ident_ref, 12)) {
                *pFileType = KTX1;
        } else if (!memcmp(pHeader->ktx2.identifier, ktx2_ident_ref, 12)) {
                *pFileType = KTX2;
        } else {
                return KTX_UNKNOWN_FILE_FORMAT;
        }
        // Read rest of header.
        if (*pFileType == KTX1) {
            // Read rest of header.
            result = pStream->read(pStream, &pHeader->ktx.endianness,
                                  KTX_HEADER_SIZE - sizeof(ktx_ident_ref));
        } else {
           result = pStream->read(pStream, &pHeader->ktx2.vkFormat,
                                 KTX2_HEADER_SIZE - sizeof(ktx2_ident_ref));
        }
    }
    return result;
}